

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

void __thiscall
cmCTestCoverageHandler::CleanCoverageLogFiles(cmCTestCoverageHandler *this,ostream *log)

{
  cmCTest *this_00;
  pointer pbVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  ostream *poVar3;
  string *f;
  pointer source;
  string logGlob;
  Glob gl;
  allocator<char> local_131;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [88];
  cmAlphaNum local_58;
  
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"BuildDirectory",&local_131);
  cmCTest::GetCTestConfiguration(&local_130,this_00,&local_f0);
  local_b0._0_8_ = local_130._M_string_length;
  local_b0._8_8_ = local_130._M_dataplus._M_p;
  local_58.View_._M_len = 9;
  local_58.View_._M_str = "/Testing/";
  cmCTest::GetCurrentTag_abi_cxx11_(&local_110,(this->super_cmCTestGenericHandler).CTest);
  cmStrCat<std::__cxx11::string,char[14]>
            (&local_d0,(cmAlphaNum *)local_b0,&local_58,&local_110,(char (*) [14])"/CoverageLog*");
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_f0);
  cmsys::Glob::Glob((Glob *)local_b0);
  cmsys::Glob::FindFiles((Glob *)local_b0,&local_d0,(GlobMessages *)0x0);
  pvVar2 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_b0);
  pbVar1 = (pvVar2->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (source = (pvVar2->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; source != pbVar1; source = source + 1) {
    poVar3 = std::operator<<(log,"Removing old coverage log: ");
    poVar3 = std::operator<<(poVar3,(string *)source);
    std::operator<<(poVar3,"\n");
    cmsys::SystemTools::RemoveFile(source);
  }
  cmsys::Glob::~Glob((Glob *)local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

void cmCTestCoverageHandler::CleanCoverageLogFiles(std::ostream& log)
{
  std::string logGlob =
    cmStrCat(this->CTest->GetCTestConfiguration("BuildDirectory"), "/Testing/",
             this->CTest->GetCurrentTag(), "/CoverageLog*");
  cmsys::Glob gl;
  gl.FindFiles(logGlob);
  std::vector<std::string> const& files = gl.GetFiles();
  for (std::string const& f : files) {
    log << "Removing old coverage log: " << f << "\n";
    cmSystemTools::RemoveFile(f);
  }
}